

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

_Bool object_curses_find_flags(player *p,object *obj,bitflag *test_flags)

{
  byte bVar1;
  _Bool _Var2;
  wchar_t index;
  wchar_t wVar3;
  wchar_t i;
  ulong uVar5;
  int flag;
  bitflag f [5];
  char o_name [80];
  size_t sVar4;
  
  sVar4 = object_desc(o_name,0x50,obj,0,p);
  bVar1 = (byte)sVar4;
  if (obj->curses != (curse_data *)0x0) {
    for (uVar5 = 1; bVar1 = z_info->curse_max, uVar5 < bVar1; uVar5 = uVar5 + 1) {
      if ((obj->curses[uVar5].power != L'\0') && (curses[uVar5].obj != (object *)0x0)) {
        object_flags(curses[uVar5].obj,f);
        flag_inter(f,test_flags,5);
        flag = 1;
        while( true ) {
          index = flag_next(f,5,flag);
          if (index == L'\0') break;
          _Var2 = flag_has_dbg(p->obj_k->flags,5,index,"p->obj_k->flags","flag");
          if (!_Var2) {
            wVar3 = rune_index(6,index);
            player_learn_rune(p,(long)wVar3,true);
            if (p->upkeep->playing == true) {
              flag_message(index,o_name);
            }
          }
          wVar3 = rune_index(5,(wchar_t)uVar5);
          if (L'\xffffffff' < wVar3) {
            player_learn_rune(p,(ulong)(uint)wVar3,true);
          }
          flag = index + L'\x01';
        }
      }
    }
  }
  return (_Bool)bVar1;
}

Assistant:

static bool object_curses_find_flags(struct player *p, struct object *obj,
							  bitflag *test_flags)
{
	char o_name[80];
	bool new = false;

	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, p);
	if (obj->curses) {
		int i;
		int index;
		bitflag f[OF_SIZE];
		int flag;

		for (i = 1; i < z_info->curse_max; i++) {
			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			/* Get all the relevant flags */
			object_flags(curses[i].obj, f);
			of_inter(f, test_flags);
			for (flag = of_next(f, FLAG_START); flag != FLAG_END;
				 flag = of_next(f, flag + 1)) {
				/* Learn any new flags */
				if (!of_has(p->obj_k->flags, flag)) {
					new = true;
					player_learn_rune(p, rune_index(RUNE_VAR_FLAG, flag), true);
					if (p->upkeep->playing) {
						flag_message(flag, o_name);
					}
				}

				/* Learn the curse */
				index = rune_index(RUNE_VAR_CURSE, i);
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
			}
		}
	}

	return new;
}